

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

bool __thiscall ON_Brep::SetTrimStartVertex(ON_Brep *this,int ti0,int vi)

{
  int iVar1;
  int iVar2;
  ON_BrepTrim *pOVar3;
  ON_BrepEdge *pOVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined7 extraout_var;
  uint uVar9;
  char cVar10;
  uint uVar11;
  uint uVar12;
  ulong unaff_R14;
  uint uVar13;
  bool bVar14;
  uint local_50;
  uint local_4c;
  ON_Brep *local_48;
  uint local_3c;
  int local_38;
  uint local_34;
  
  if (-1 < (vi | ti0)) {
    uVar5 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count;
    local_50 = 0;
    uVar11 = ti0;
    local_48 = this;
    local_3c = uVar5;
    local_38 = vi;
    if (-1 < ti0) {
      uVar9 = 0;
      local_4c = ti0;
      local_34 = ti0;
      do {
        uVar6 = local_34;
        uVar11 = local_4c;
        uVar5 = local_50;
        if (((uVar9 != 0) && (local_4c == local_34)) && (local_50 == 0)) goto LAB_003f4957;
        pOVar3 = (local_48->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                 m_a;
        uVar7 = (ulong)local_4c;
        if (pOVar3[uVar7].m_type == singular) {
          pOVar3[uVar7].m_vi[1] = local_38;
          pOVar3[uVar7].m_vi[0] = local_38;
          if (local_50 == 1) {
            local_50 = -(local_50 - 1);
            local_4c = PrevTrim(local_48,local_4c);
          }
          else {
            local_50 = -(local_50 - 1);
            local_4c = NextTrim(local_48,local_4c);
          }
          local_50 = uVar5;
          if ((uVar5 != 0) || (local_4c != uVar6)) {
            cVar10 = '\x04';
            if (pOVar3[(int)local_4c].m_type != singular) {
              HopAcrossEdge(local_48,(int *)&local_4c,(int *)&local_50);
              cVar10 = '\x04';
            }
            goto LAB_003f4792;
          }
          uVar7 = CONCAT71((uint7)(uint3)(local_4c >> 8),1);
LAB_003f4799:
          cVar10 = '\x01';
        }
        else {
          uVar12 = 1 - local_50;
          cVar10 = '\x01';
          uVar6 = local_50;
          if (pOVar3[uVar7].m_bRev3d != false) {
            uVar6 = uVar12;
          }
          bVar14 = SetEdgeVertex(local_48,pOVar3[uVar7].m_ei,uVar6,local_38);
          if (!bVar14) {
LAB_003f4797:
            uVar7 = 0;
            goto LAB_003f4799;
          }
          if (uVar5 == 0) {
            local_4c = PrevTrim(local_48,uVar11);
          }
          else {
            local_4c = NextTrim(local_48,uVar11);
          }
          local_50 = uVar12;
          if ((int)local_4c < 0) goto LAB_003f4797;
          pOVar3 = (local_48->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                   super_ON_ClassArray<ON_BrepTrim>.m_a;
          if (pOVar3[local_4c].m_type == singular) {
            cVar10 = '\x04';
LAB_003f4792:
            uVar7 = unaff_R14 & 0xffffffff;
          }
          else {
            iVar1 = pOVar3[local_4c].m_ei;
            uVar7 = 0;
            if ((-1 < (long)iVar1) && (iVar1 < (int)local_3c)) {
              if (pOVar3[local_4c].m_bRev3d != false) {
                uVar12 = uVar5;
              }
              iVar2 = (local_48->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                      super_ON_ClassArray<ON_BrepEdge>.m_a[iVar1].m_ti.m_count;
              cVar10 = '\x02';
              if (0 < iVar2) {
                if (iVar2 == 1) {
                  SetEdgeVertex(local_48,iVar1,uVar12,local_38);
                  cVar10 = '\x02';
                }
                else {
                  bVar14 = HopAcrossEdge(local_48,(int *)&local_4c,(int *)&local_50);
                  unaff_R14 = CONCAT71((int7)(unaff_R14 >> 8),(byte)unaff_R14 & bVar14);
                  cVar10 = !bVar14;
                }
              }
              goto LAB_003f4792;
            }
          }
        }
        uVar5 = (uint)uVar7;
        uVar11 = local_34;
        if ((cVar10 != '\0') && (cVar10 != '\x04')) {
          if (cVar10 != '\x02') goto LAB_003f4c62;
          break;
        }
        if (((int)local_4c < 0) ||
           (bVar14 = 0x1fe < uVar9, unaff_R14 = uVar7, uVar9 = uVar9 + 1, bVar14)) break;
      } while( true );
    }
    local_50 = 0;
    pOVar3 = (local_48->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
    local_4c = uVar11;
    if (pOVar3[(int)uVar11].m_type == singular) {
      uVar8 = (ulong)(int)uVar11;
      uVar7 = uVar8;
      if (pOVar3[uVar8].m_type == singular) {
        do {
          if ((uint)uVar8 != uVar11) {
            pOVar3[uVar7].m_vi[0] = local_38;
            pOVar3[uVar7].m_vi[1] = local_38;
          }
          uVar6 = PrevTrim(local_48,(uint)uVar8);
          uVar8 = (ulong)uVar6;
          uVar9 = 1;
        } while ((uVar6 != uVar11) &&
                (uVar7 = (long)(int)uVar6, pOVar3[(int)uVar6].m_type == singular));
      }
      else {
        uVar9 = 0;
        uVar6 = uVar11;
      }
      uVar11 = pOVar3[(int)uVar6].m_ei;
      local_50 = uVar9;
      local_4c = uVar6;
      if (-1 < (int)uVar11) {
        uVar12 = 1 - uVar9;
        if (pOVar3[(int)uVar6].m_bRev3d == false) {
          uVar12 = uVar9;
        }
        SetEdgeVertex(local_48,uVar11,uVar12,local_38);
      }
    }
    else {
      uVar11 = pOVar3[(int)uVar11].m_ei;
    }
    if (((int)uVar11 < 0) ||
       (pOVar4 = (local_48->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.
                 m_a, pOVar4[uVar11].m_ti.m_count < 2)) {
LAB_003f4957:
      uVar7 = 1;
      goto LAB_003f4c62;
    }
    bVar14 = HopAcrossEdge(local_48,(int *)&local_4c,(int *)&local_50);
    uVar11 = local_50;
    if (bVar14) {
      if (local_50 == 0) {
        local_4c = PrevTrim(local_48,local_4c);
      }
      else {
        local_4c = NextTrim(local_48,local_4c);
      }
      if (-1 < (int)local_4c) {
        local_50 = 1 - uVar11;
        pOVar3 = (local_48->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                 m_a;
        if (pOVar3[local_4c].m_type == singular) {
LAB_003f49d1:
          uVar11 = local_4c;
          if (-1 < (int)local_4c) {
            local_34 = local_50;
            uVar9 = 0;
            local_3c = uVar5;
            do {
              uVar6 = local_4c;
              uVar5 = local_50;
              uVar12 = local_50 ^ local_34;
              if ((local_4c == uVar11 && uVar12 == 0) && uVar9 != 0) break;
              pOVar3 = (local_48->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                       super_ON_ClassArray<ON_BrepTrim>.m_a;
              uVar7 = (ulong)local_4c;
              if (pOVar3[uVar7].m_type == singular) {
                pOVar3[uVar7].m_vi[1] = local_38;
                pOVar3[uVar7].m_vi[0] = local_38;
                if (local_50 == 1) {
                  local_50 = -(local_50 - 1);
                  local_4c = PrevTrim(local_48,local_4c);
                }
                else {
                  local_50 = -(local_50 - 1);
                  local_4c = NextTrim(local_48,local_4c);
                }
                local_50 = uVar5;
                if (local_4c == uVar11 && uVar12 == 0) goto LAB_003f4b2a;
                cVar10 = '\t';
                if (pOVar3[(int)local_4c].m_type != singular) {
                  HopAcrossEdge(local_48,(int *)&local_4c,(int *)&local_50);
                  cVar10 = '\t';
                }
              }
              else {
                uVar13 = 1 - local_50;
                uVar12 = local_50;
                if (pOVar3[uVar7].m_bRev3d != false) {
                  uVar12 = uVar13;
                }
                bVar14 = SetEdgeVertex(local_48,pOVar3[uVar7].m_ei,uVar12,local_38);
                if (bVar14) {
                  if (uVar5 == 0) {
                    local_4c = PrevTrim(local_48,uVar6);
                  }
                  else {
                    local_4c = NextTrim(local_48,uVar6);
                  }
                  local_50 = uVar13;
                  if (-1 < (int)local_4c) {
                    pOVar3 = (local_48->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                             super_ON_ClassArray<ON_BrepTrim>.m_a;
                    if (pOVar3[local_4c].m_type == singular) {
                      cVar10 = '\t';
                    }
                    else {
                      iVar1 = pOVar3[local_4c].m_ei;
                      cVar10 = '\x01';
                      if ((long)iVar1 < 0) {
                        local_3c = 0;
                      }
                      else {
                        if (pOVar3[local_4c].m_bRev3d != false) {
                          uVar13 = uVar5;
                        }
                        iVar2 = (local_48->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                                super_ON_ClassArray<ON_BrepEdge>.m_a[iVar1].m_ti.m_count;
                        if (iVar2 < 1) {
                          cVar10 = '\a';
                        }
                        else if (iVar2 == 1) {
                          SetEdgeVertex(local_48,iVar1,uVar13,local_38);
                          local_3c = (uint)CONCAT71(extraout_var,1);
                        }
                        else {
                          bVar14 = HopAcrossEdge(local_48,(int *)&local_4c,(int *)&local_50);
                          local_3c = CONCAT31((int3)(local_3c >> 8),(byte)local_3c & bVar14);
                          cVar10 = !bVar14;
                        }
                      }
                    }
                    goto LAB_003f4b37;
                  }
                }
LAB_003f4b2a:
                local_3c = 0;
                cVar10 = '\x01';
              }
LAB_003f4b37:
              if ((cVar10 != '\0') && (cVar10 != '\t')) {
                if (cVar10 == '\a') break;
                uVar7 = (ulong)local_3c;
                goto LAB_003f4c62;
              }
              uVar7 = 0;
              if (((int)local_4c < 0) || (bVar14 = 0x1fe < uVar9, uVar9 = uVar9 + 1, bVar14))
              goto LAB_003f4c62;
            } while( true );
          }
        }
        else {
          iVar1 = pOVar3[local_4c].m_ei;
          if (-1 < (long)iVar1) {
            if (pOVar4[iVar1].m_ti.m_count == 1) {
              uVar5 = local_50;
              if (pOVar3[local_4c].m_bRev3d != false) {
                uVar5 = uVar11;
              }
              SetEdgeVertex(local_48,iVar1,uVar5,local_38);
              goto LAB_003f4957;
            }
            bVar14 = HopAcrossEdge(local_48,(int *)&local_4c,(int *)&local_50);
            if (bVar14) goto LAB_003f49d1;
          }
        }
      }
    }
  }
  uVar7 = 0;
LAB_003f4c62:
  return (bool)((byte)uVar7 & 1);
}

Assistant:

bool ON_Brep::SetTrimStartVertex( const int ti0, const int vi )
{
  // Do not use NextEdge(), PrevEdge() because they require
  // the information we are in the act of creating.
  if ( ti0 < 0 || vi < 0 )
    return false;
  int next_ti, ti, ei, evi, tvi, counter;

  const int edge_count = m_E.Count();

  // Step counter clockwise around vertex until we hit a boundary
  // or we get back to where we started.
  for ( ti = ti0, tvi = 0, counter = 0; ti >= 0 && counter < 512; counter++ ) {
    if ( counter > 0 ) {
      if ( ti == ti0 && tvi == 0 )
        return true; // vertex was interior
    }
    ON_BrepTrim& trim = m_T[ti];
    if ( trim.m_type == ON_BrepTrim::singular ) {
      trim.m_vi[0] = trim.m_vi[1] = vi;
      tvi = 1-tvi;
      next_ti = (tvi) ? NextTrim(ti) : PrevTrim(ti);
      ti = next_ti;
      tvi = 1-tvi;
      if ( ti == ti0 && tvi == 0 )
        return true; // vertex was interior
      if ( m_T[ti].m_type != ON_BrepTrim::singular )
        HopAcrossEdge( ti, tvi ); // OK if hop fails because ti is a boundary
      continue;
    }

    ei = trim.m_ei;
    evi = (trim.m_bRev3d) ? 1-tvi : tvi;
    if ( !SetEdgeVertex( ei, evi, vi ) )
      return false;
    next_ti = (tvi) ? NextTrim(ti) : PrevTrim(ti);
    ti = next_ti;
    tvi = 1-tvi;
    if ( ti < 0 )
      return false; // should not happen

    if ( m_T[ti].m_type == ON_BrepTrim::singular )
      continue;
    ei = m_T[ti].m_ei;
    if ( ei < 0 || ei >= edge_count )
      return false; // should not happen
    evi = (m_T[ti].m_bRev3d) ? 1-tvi : tvi;
    const int edge_trim_count = m_E[ei].m_ti.Count();
    if ( edge_trim_count < 1 )
      break; // should not happen
    if ( edge_trim_count == 1 ) {
      SetEdgeVertex( ei, evi, vi );
      break; // ran into boundary
    }
    if ( !HopAcrossEdge( ti, tvi ) )
      return false;
  }


  // Get ready to step counter clockwise around vertex until
  // we hit a boundary.
  ti = ti0;
  tvi = 0;
  if ( m_T[ti].m_type == ON_BrepTrim::singular ) {
    // back up until we get to a non-singular trim
    while ( m_T[ti].m_type == ON_BrepTrim::singular ) {
      if ( ti != ti0 ) {
        m_T[ti].m_vi[0] = vi;
        m_T[ti].m_vi[1] = vi;
      }
      ti = PrevTrim(ti);
      tvi = 1;
      if ( ti == ti0 )
        break;
    }
    ei = m_T[ti].m_ei;
    if ( ei >= 0 ) {
      evi = (m_T[ti].m_bRev3d) ? 1-tvi : tvi;
      SetEdgeVertex( ei, evi, vi );
    }
  }
  else {
    ei = m_T[ti].m_ei;
  }
  if ( ei < 0 ) {
    // did the best we could - return true so setter keeps going
    // but the fact we are here means the brep is bogus.
    return true;
  }
  if ( m_E[ei].m_ti.Count() < 2 )
    return true; // ti0 is a boundary - we're done.
  if ( !HopAcrossEdge( ti, tvi ) )
    return false;
  next_ti = (tvi) ? NextTrim(ti) : PrevTrim(ti);
  if ( next_ti < 0 )
    return false;
  ti = next_ti;
  tvi = 1-tvi;
  if ( m_T[ti].m_type != ON_BrepTrim::singular ) {
    ei = m_T[ti].m_ei;
    if ( ei < 0 )
      return false;
    if ( m_E[ei].m_ti.Count() == 1 ) {
      evi = (m_T[ti].m_bRev3d)? 1-tvi : tvi;
      SetEdgeVertex( ei, evi, vi );
      return true;
    }
    if ( !HopAcrossEdge( ti, tvi ) )
      return false;
  }

  const int ti1 = ti;
  const int tvi1 = tvi;
  
  for ( ti = ti1, tvi = tvi1, counter = 0; ti >= 0 && counter < 512; counter++ ) {
    if ( counter > 0 ) {
      if ( ti == ti1 && tvi == tvi1 )
        return false; // vertex is not interior - so this should not happen
    }
    ON_BrepTrim& trim = m_T[ti];
    if ( trim.m_type == ON_BrepTrim::singular ) {
      trim.m_vi[0] = trim.m_vi[1] = vi;
      tvi = 1-tvi;
      next_ti = (tvi) ? NextTrim(ti) : PrevTrim(ti);
      ti = next_ti;
      tvi = 1-tvi;
      if ( ti == ti1 && tvi == tvi1 )
        return false; // vertex is not interior - so this should not happen
      if ( m_T[ti].m_type != ON_BrepTrim::singular )
        HopAcrossEdge( ti, tvi );  // OK if hop fails because ti is a boundary
      continue;
    }

    ei = trim.m_ei;
    evi = (trim.m_bRev3d) ? 1-tvi : tvi;
    if ( !SetEdgeVertex( ei, evi, vi ) )
      return false;
    next_ti = (tvi) ? NextTrim(ti) : PrevTrim(ti);
    ti = next_ti;
    tvi = 1-tvi;
    if ( ti < 0 )
      return false; // should not happen
    
    if ( m_T[ti].m_type == ON_BrepTrim::singular )
      continue;
    ei = m_T[ti].m_ei;
    if ( ei < 0 )
      return false; // should not happen
    evi = (m_T[ti].m_bRev3d) ? 1-tvi : tvi;
    const int edge_trim_count = m_E[ei].m_ti.Count();
    if ( edge_trim_count < 1 )
      break; // should not happen
    if ( edge_trim_count == 1 ) {
      SetEdgeVertex( ei, evi, vi );
      return true; // ran into boundary - expected
    }
    if ( !HopAcrossEdge( ti, tvi ) )
      return false;
  }

  return false; // should have exited by hitting "expected" boundary ~10 lines above
}